

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeUtils.h
# Opt level: O0

void TimeUtils::addOffset(timeval *t,int msecs)

{
  int msecs_local;
  timeval *t_local;
  
  t->tv_sec = (long)(msecs / 1000) + t->tv_sec;
  t->tv_usec = (long)((msecs % 1000) * 1000) + t->tv_usec;
  if (t->tv_usec < 1000000) {
    if (t->tv_usec < 0) {
      t->tv_sec = t->tv_sec + -1;
      t->tv_usec = t->tv_usec + 1000000;
    }
  }
  else {
    t->tv_sec = t->tv_sec + 1;
    t->tv_usec = t->tv_usec + -1000000;
  }
  return;
}

Assistant:

inline void addOffset( struct timeval *t, int msecs )
	{
		t->tv_sec += msecs / 1000;
		t->tv_usec += (msecs % 1000) * 1000;

		if (t->tv_usec >= 1000000)
		{
			t->tv_sec++;
			t->tv_usec -= 1000000;
		}
		else if (t->tv_usec < 0)
		{
			t->tv_sec--;
			t->tv_usec += 1000000;
		}
	}